

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O3

uchar MX_EQ(uint **a,uint a_rows,uint a_cols,uint **b,uint b_rows,uint b_cols)

{
  uchar uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (b_cols == a_cols && b_rows == a_rows) {
    uVar1 = '\x01';
    if (a_rows != 0) {
      uVar2 = 0;
      bVar4 = false;
      do {
        if (a_cols != 0) {
          uVar3 = 0;
          do {
            if (a[uVar2][uVar3] != b[uVar2][uVar3]) {
              return bVar4;
            }
            uVar3 = uVar3 + 1;
          } while (a_cols != uVar3);
        }
        uVar2 = uVar2 + 1;
        bVar4 = a_rows <= uVar2;
      } while (uVar2 != a_rows);
      return '\x01';
    }
  }
  else {
    uVar1 = '\0';
  }
  return uVar1;
}

Assistant:

uint8_t MX_EQ(uint32_t **a, uint32_t a_rows, uint32_t a_cols,
          uint32_t **b, uint32_t b_rows, uint32_t b_cols)
{
    if (a_rows != b_rows)
        return 0;
    if (a_cols != b_cols)
        return 0;

    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < a_cols; j++)
            if (a[i][j] != b[i][j])
                return 0;
    return 1;
}